

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemModel.hpp
# Opt level: O1

void __thiscall
KalmanExamples::Robot1::SystemModel<float,_Kalman::StandardBase>::updateJacobians
          (SystemModel<float,_Kalman::StandardBase> *this,S *x,C *u)

{
  DenseStorage<float,_9,_3,_3,_0> *pDVar1;
  float fVar2;
  
  *(undefined8 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).
    super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    .field_0x2c = 0;
  *(undefined8 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).field_0x34 = 0;
  *(undefined8 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).field_0x3c = 0;
  *(undefined8 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).field_0x44 = 0;
  *(undefined4 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).field_0x4c = 0;
  *(undefined4 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).
    super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    .field_0x2c = 0x3f800000;
  fVar2 = sinf((x->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
               + (u->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                 [1]);
  *(float *)&(this->
             super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
             ).field_0x44 =
       -fVar2 * (u->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
                super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                [0];
  *(undefined4 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).field_0x3c = 0x3f800000;
  fVar2 = cosf((x->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
               + (u->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
                 [1]);
  *(float *)&(this->
             super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
             ).field_0x48 =
       fVar2 * (u->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
  ;
  *(undefined8 *)
   &(this->
    super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
    ).field_0x4c = 0x3f8000003f800000;
  pDVar1 = &(this->
            super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
            ).W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage;
  (pDVar1->m_data).array[1] = 0.0;
  (pDVar1->m_data).array[2] = 0.0;
  pDVar1 = &(this->
            super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
            ).W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage;
  (pDVar1->m_data).array[3] = 0.0;
  (pDVar1->m_data).array[4] = 1.0;
  pDVar1 = &(this->
            super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
            ).W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage;
  (pDVar1->m_data).array[5] = 0.0;
  (pDVar1->m_data).array[6] = 0.0;
  pDVar1 = &(this->
            super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
            ).W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage;
  (pDVar1->m_data).array[7] = 0.0;
  (pDVar1->m_data).array[8] = 1.0;
  return;
}

Assistant:

void updateJacobians( const S& x, const C& u )
    {
        // F = df/dx (Jacobian of state transition w.r.t. the state)
        this->F.setZero();
        
        // partial derivative of x.x() w.r.t. x.x()
        this->F( S::X, S::X ) = 1;
        // partial derivative of x.x() w.r.t. x.theta()
        this->F( S::X, S::THETA ) = -std::sin( x.theta() + u.dtheta() ) * u.v();
        
        // partial derivative of x.y() w.r.t. x.y()
        this->F( S::Y, S::Y ) = 1;
        // partial derivative of x.y() w.r.t. x.theta()
        this->F( S::Y, S::THETA ) = std::cos( x.theta() + u.dtheta() ) * u.v();
        
        // partial derivative of x.theta() w.r.t. x.theta()
        this->F( S::THETA, S::THETA ) = 1;
        
        // W = df/dw (Jacobian of state transition w.r.t. the noise)
        this->W.setIdentity();
        // TODO: more sophisticated noise modelling
        //       i.e. The noise affects the the direction in which we move as 
        //       well as the velocity (i.e. the distance we move)
    }